

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

return_of_t<void_()> __thiscall
trompeloeil::mock_func<false,void()>
          (trompeloeil *this,char *param_2,char *param_3,undefined8 param_4,
          call_params_type_t<void_()> *param_5)

{
  call_matcher_base<void_()> *pcVar1;
  call_params_type_t<void_()> param_value;
  unique_lock<std::recursive_mutex> lock;
  trace_agent ta;
  undefined1 local_202 [2];
  unique_lock<std::recursive_mutex> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  trace_agent local_1b0;
  
  get_lock<void>();
  local_202[0] = (call_params_type_t<void_()>)0x0;
  pcVar1 = find<void()>((call_matcher_list<void_()> *)this,(call_params_type_t<void_()> *)local_202)
  ;
  if (pcVar1 != (call_matcher_base<void_()> *)0x0) {
    report_match<void()>((call_matcher_list<void_()> *)this);
    trace_agent::trace_agent(&local_1b0,pcVar1->loc,pcVar1->name,tracer_obj()::ptr);
    (*(pcVar1->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem[5])
              (pcVar1,local_202,this + 0x18);
    (*(pcVar1->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem[8])
              (pcVar1,&local_1b0,local_202);
    trace_agent::~trace_agent(&local_1b0);
    Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_200);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0," with signature ",(allocator<char> *)(local_202 + 1));
  std::operator+(&local_1d0,param_2,&local_1f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 &local_1d0,param_3);
  report_mismatch<void()>
            (this,(call_matcher_list<void_()> *)(this + 0x18),
             (call_matcher_list<void_()> *)&local_1b0,(string *)local_202,param_5);
}

Assistant:

return_of_t<Sig>
  mock_func(std::true_type,
            expectations<movable, Sig>& e,
            char const *func_name,
            char const *sig_name,
            P&& ... p)
  {
    auto lock = get_lock();

    call_params_type_t<void(P...)> param_value(std::forward<P>(p)...);

    auto i = find(e.active, param_value);
    if (!i)
    {
      report_mismatch(e.active,
                      e.saturated,
                      func_name + std::string(" with signature ") + sig_name,
                      param_value);
    }
    else{
        report_match(e.active);
    }
    trace_agent ta{i->loc, i->name, tracer_obj()};
    try
    {
      ta.trace_params(param_value);
      i->run_actions(param_value, e.saturated);
      return i->return_value(ta, param_value);
    }
    catch (...)
    {
      ta.trace_exception();
      throw;
    }
  }